

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O0

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::step_three(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
             *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  _Bit_const_iterator __last;
  _Bit_const_iterator __first;
  bool bVar1;
  pointer pAVar2;
  Value __n;
  reference pvVar3;
  _Bit_type *p_Var4;
  ulong uVar5;
  long in_RDI;
  const_iterator cVar6;
  size_t col_count;
  AdjacencyIterator it;
  unsigned_long *row;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_ffffffffffffff48;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff8c;
  reference local_48;
  Adjacency<unsigned_long> *local_38;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_30;
  reference local_28;
  unsigned_long *local_20;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_18;
  long local_10;
  
  local_10 = in_RDI + 0x18;
  local_18._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff48
                 );
  local_20 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    local_28 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_18);
    local_30._M_current =
         (Adjacency<unsigned_long> *)
         andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
         adjacenciesFromVertexBegin(in_stack_ffffffffffffff48,0x1cf8f0);
    while( true ) {
      local_38 = (Adjacency<unsigned_long> *)
                 andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                 adjacenciesFromVertexEnd(in_stack_ffffffffffffff48,0x1cf910);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                          *)in_stack_ffffffffffffff50,
                         (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                          *)in_stack_ffffffffffffff48);
      if (!bVar1) break;
      this_00 = *(vector<int,_std::allocator<int>_> **)(in_RDI + 0x10);
      pAVar2 = __gnu_cxx::
               __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
               ::operator->(&local_30);
      __n = andres::graph::Adjacency<unsigned_long>::edge(pAVar2);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_00,__n);
      if (*pvVar3 == 1) {
        in_stack_ffffffffffffff50 =
             (Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
              *)(in_RDI + 0x70);
        pAVar2 = __gnu_cxx::
                 __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                 ::operator->(&local_30);
        andres::graph::Adjacency<unsigned_long>::vertex(pAVar2);
        col_of_idx(in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
        local_48 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (in_stack_ffffffffffffff70,
                              CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        std::_Bit_reference::operator=(&local_48,true);
      }
      __gnu_cxx::
      __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
      ::operator++(&local_30);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_18);
  }
  cVar6 = std::vector<bool,_std::allocator<bool>_>::cbegin
                    ((vector<bool,_std::allocator<bool>_> *)0x1cf9fb);
  p_Var4 = cVar6.super__Bit_iterator_base._M_p;
  cVar6 = std::vector<bool,_std::allocator<bool>_>::cend
                    ((vector<bool,_std::allocator<bool>_> *)0x1cfa1f);
  __first.super__Bit_iterator_base._M_p._4_4_ = in_stack_ffffffffffffff8c;
  __first.super__Bit_iterator_base._M_p._0_4_ = cVar6.super__Bit_iterator_base._M_offset;
  __first.super__Bit_iterator_base._8_8_ = p_Var4;
  __last.super__Bit_iterator_base._M_p._4_4_ = in_stack_ffffffffffffff7c;
  __last.super__Bit_iterator_base._M_p._0_4_ = cVar6.super__Bit_iterator_base._M_offset;
  __last.super__Bit_iterator_base._8_8_ = cVar6.super__Bit_iterator_base._M_p;
  uVar5 = std::count<std::_Bit_const_iterator,bool>
                    (__first,__last,(bool *)cVar6.super__Bit_iterator_base._M_p);
  if (uVar5 < *(ulong *)(in_RDI + 0xb0)) {
    *(undefined4 *)(in_RDI + 0xb8) = 3;
  }
  else {
    *(undefined4 *)(in_RDI + 0xb8) = 6;
  }
  return;
}

Assistant:

void
Matching<GRAPH, COST, MASK>::step_three()
{
    for (auto const& row : rows_)
        for (auto it = graph_.adjacenciesFromVertexBegin(row);
             it != graph_.adjacenciesFromVertexEnd(row); ++it)
            if (mask_[it->edge()] == STARRED)
                col_cover[col_of_idx(it->vertex())] = true;

    const size_t col_count =
        std::count(col_cover.cbegin(), col_cover.cend(), true);

    // if the matching is already perfect, then we are done.
    if (col_count >= max_matches_)
        step_ = Step::SEVEN;
    else
        step_ = Step::FOUR;
}